

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

int __thiscall
TPZBlockDiagonal<std::complex<float>_>::ClassId(TPZBlockDiagonal<std::complex<float>_> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZBlockDiagonal",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZMatrix<std::complex<float>_>::ClassId(&this->super_TPZMatrix<std::complex<float>_>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZBlockDiagonal<TVar>::ClassId() const{
    return Hash("TPZBlockDiagonal") ^ TPZMatrix<TVar>::ClassId() << 1;
}